

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerVk.cpp
# Opt level: O1

ShaderVariableVkImpl * __thiscall
Diligent::ShaderVariableManagerVk::GetVariable(ShaderVariableManagerVk *this,Char *Name)

{
  ShaderVariableVkImpl *pSVar1;
  int iVar2;
  PipelineResourceDesc *pPVar3;
  long lVar4;
  ulong uVar5;
  
  if (this->m_NumVariables != 0) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      pSVar1 = (this->
               super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
               ).m_pVariables;
      pPVar3 = GetResourceDesc(*(ShaderVariableManagerVk **)
                                ((long)&(pSVar1->
                                        super_ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
                                        ).m_ParentManager + lVar4),
                               *(Uint32 *)
                                ((long)&(pSVar1->
                                        super_ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
                                        ).m_ResIndex + lVar4));
      iVar2 = strcmp(pPVar3->Name,Name);
      if (iVar2 == 0) {
        return (ShaderVariableVkImpl *)
               ((long)&(pSVar1->
                       super_ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
                       ).super_IShaderResourceVariable.super_IObject._vptr_IObject + lVar4);
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x18;
    } while (uVar5 < this->m_NumVariables);
  }
  return (ShaderVariableVkImpl *)0x0;
}

Assistant:

ShaderVariableVkImpl* ShaderVariableManagerVk::GetVariable(const Char* Name) const
{
    for (Uint32 v = 0; v < m_NumVariables; ++v)
    {
        ShaderVariableVkImpl& Var = m_pVariables[v];
        if (strcmp(Var.GetDesc().Name, Name) == 0)
            return &Var;
    }
    return nullptr;
}